

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_dma_heap.c
# Opt level: O0

MPP_RET os_allocator_dma_heap_alloc(void *ctx,MppBufferInfo *info)

{
  allocator_ctx_dmaheap *p;
  MPP_RET ret;
  MppBufferInfo *info_local;
  void *ctx_local;
  
  if (ctx == (void *)0x0) {
    _mpp_log_l(2,"mpp_dma_heap","does not accept NULL input\n","os_allocator_dma_heap_alloc");
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    ctx_local._4_4_ =
         dma_heap_alloc(*(int *)((long)ctx + 4),info->size,&info->fd,*(RK_U32 *)((long)ctx + 8));
    if ((dma_heap_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dma_heap","dev %d alloc %3d size %d\n",(char *)0x0,
                 (ulong)*(uint *)((long)ctx + 4),(ulong)(uint)info->fd,info->size);
    }
    if (ctx_local._4_4_ == MPP_OK) {
      info->ptr = (void *)0x0;
    }
    else {
      _mpp_log_l(2,"mpp_dma_heap","dma_heap_alloc failed ret %d\n","os_allocator_dma_heap_alloc",
                 (ulong)(uint)ctx_local._4_4_);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET os_allocator_dma_heap_alloc(void *ctx, MppBufferInfo *info)
{
    MPP_RET ret = MPP_OK;
    allocator_ctx_dmaheap *p = NULL;

    if (NULL == ctx) {
        mpp_err_f("does not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    p = (allocator_ctx_dmaheap *)ctx;

    ret = dma_heap_alloc(p->device, info->size, (RK_S32 *)&info->fd, p->flags);

    dma_heap_dbg_ops("dev %d alloc %3d size %d\n", p->device, info->fd, info->size);

    if (ret) {
        mpp_err_f("dma_heap_alloc failed ret %d\n", ret);
        return ret;
    }

    info->ptr = NULL;
    return ret;
}